

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_get_length_in_pcm_frames(ma_decoder *pDecoder,ma_uint64 *pLength)

{
  ma_uint64 mVar1;
  ma_uint64 *in_RSI;
  ma_uint32 *in_RDI;
  ma_format *unaff_retaddr;
  ma_data_source *in_stack_00000008;
  ma_uint32 internalSampleRate;
  ma_uint64 internalLengthInPCMFrames;
  ma_result result;
  undefined4 in_stack_ffffffffffffffd0;
  ma_uint32 in_stack_ffffffffffffffd4;
  ma_data_source *in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_result mVar2;
  
  if (in_RSI == (ma_uint64 *)0x0) {
    mVar2 = MA_INVALID_ARGS;
  }
  else {
    *in_RSI = 0;
    if (in_RDI == (ma_uint32 *)0x0) {
      mVar2 = MA_INVALID_ARGS;
    }
    else if (*(long *)(in_RDI + 0x12) == 0) {
      mVar2 = MA_NO_BACKEND;
    }
    else {
      mVar2 = ma_data_source_get_length_in_pcm_frames
                        (in_stack_ffffffffffffffd8,
                         (ma_uint64 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
      ;
      if ((mVar2 == MA_SUCCESS) &&
         (mVar2 = ma_data_source_get_data_format
                            (in_stack_00000008,unaff_retaddr,
                             (ma_uint32 *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                             (ma_channel *)in_RSI,(ulong)in_stack_ffffffffffffffe0),
         mVar2 == MA_SUCCESS)) {
        if (in_stack_ffffffffffffffd4 == in_RDI[0x24]) {
          *in_RSI = (ma_uint64)in_stack_ffffffffffffffd8;
        }
        else {
          mVar1 = ma_calculate_frame_count_after_resampling
                            (in_RDI[0x24],in_stack_ffffffffffffffd4,
                             (ma_uint64)in_stack_ffffffffffffffd8);
          *in_RSI = mVar1;
        }
        mVar2 = MA_SUCCESS;
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_decoder_get_length_in_pcm_frames(ma_decoder* pDecoder, ma_uint64* pLength)
{
    if (pLength == NULL) {
        return MA_INVALID_ARGS;
    }

    *pLength = 0;

    if (pDecoder == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pDecoder->pBackend != NULL) {
        ma_result result;
        ma_uint64 internalLengthInPCMFrames;
        ma_uint32 internalSampleRate;

        result = ma_data_source_get_length_in_pcm_frames(pDecoder->pBackend, &internalLengthInPCMFrames);
        if (result != MA_SUCCESS) {
            return result;  /* Failed to retrieve the internal length. */
        }

        result = ma_data_source_get_data_format(pDecoder->pBackend, NULL, NULL, &internalSampleRate, NULL, 0);
        if (result != MA_SUCCESS) {
            return result;   /* Failed to retrieve the internal sample rate. */
        }

        if (internalSampleRate == pDecoder->outputSampleRate) {
            *pLength = internalLengthInPCMFrames;
        } else {
            *pLength = ma_calculate_frame_count_after_resampling(pDecoder->outputSampleRate, internalSampleRate, internalLengthInPCMFrames);
        }

        return MA_SUCCESS;
    } else {
        return MA_NO_BACKEND;
    }
}